

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_manager_impl.c
# Opt level: O3

void loader_manager_impl_destroy(loader_manager_impl manager_impl)

{
  if (manager_impl != (loader_manager_impl)0x0) {
    if (manager_impl->initialization_order != (vector)0x0) {
      vector_destroy(manager_impl->initialization_order);
    }
    if (manager_impl->destroy_map != (set)0x0) {
      set_destroy(manager_impl->destroy_map);
    }
    manager_impl->init_thread_id = 0xffffffffffffffff;
    if (manager_impl->script_paths != (vector)0x0) {
      loader_manager_impl_script_paths_destroy(manager_impl->script_paths);
    }
    free(manager_impl);
    return;
  }
  return;
}

Assistant:

void loader_manager_impl_destroy(loader_manager_impl manager_impl)
{
	if (manager_impl != NULL)
	{
		if (manager_impl->initialization_order != NULL)
		{
			vector_destroy(manager_impl->initialization_order);
		}

		if (manager_impl->destroy_map != NULL)
		{
			set_destroy(manager_impl->destroy_map);
		}

		manager_impl->init_thread_id = THREAD_ID_INVALID;

		if (manager_impl->script_paths != NULL)
		{
			loader_manager_impl_script_paths_destroy(manager_impl->script_paths);
		}

		free(manager_impl);
	}
}